

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int convertCompoundSelectToSubquery(Walker *pWalker,Select *p)

{
  uint uVar1;
  Parse *pParse;
  sqlite3 *db;
  Expr **ppEVar2;
  undefined1 uVar3;
  LogEst LVar4;
  u32 uVar5;
  ExprList_item *pEVar6;
  Select *pSVar7;
  SrcList *pList;
  Expr *pExpr;
  ExprList *pEVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  Select *pSVar15;
  Select *pSVar16;
  long in_FS_OFFSET;
  byte bVar17;
  undefined1 local_58 [8];
  undefined1 *puStack_50;
  Token local_48;
  long local_38;
  
  bVar17 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  iVar13 = 0;
  iVar14 = 0;
  if ((p->pPrior != (Select *)0x0) &&
     (pEVar8 = p->pOrderBy, iVar14 = iVar13, p != (Select *)0x0 && pEVar8 != (ExprList *)0x0)) {
    pSVar7 = p;
    do {
      if ((pSVar7->op != 0x8b) && (pSVar7->op != 0x88)) {
        if (pEVar8->a[0].u.x.iOrderByCol == 0) {
          uVar1 = pEVar8->nExpr;
          uVar10 = (ulong)uVar1;
          pEVar6 = pEVar8->a + (uVar10 - 1);
          goto LAB_00184ccd;
        }
        break;
      }
      pSVar7 = pSVar7->pPrior;
    } while (pSVar7 != (Select *)0x0);
  }
  goto LAB_00184c93;
  while( true ) {
    ppEVar2 = &pEVar6->pExpr;
    uVar10 = (ulong)(uVar9 - 1);
    pEVar6 = pEVar6 + -1;
    uVar12 = uVar9;
    if (((*ppEVar2)->flags & 0x200) != 0) break;
LAB_00184ccd:
    uVar9 = (uint)uVar10;
    uVar12 = (int)uVar1 >> 0x1f & uVar1;
    if ((int)uVar9 < 1) break;
  }
  if (0 < (int)uVar12) {
    pParse = pWalker->pParse;
    db = pParse->db;
    pSVar7 = (Select *)sqlite3DbMallocZero(db,0x80);
    iVar14 = 2;
    if (pSVar7 != (Select *)0x0) {
      local_58 = (undefined1  [8])0x0;
      puStack_50 = (undefined1 *)0x0;
      pList = sqlite3SrcListAppendFromTerm
                        (pParse,(SrcList *)0x0,(Token *)0x0,(Token *)0x0,(Token *)local_58,pSVar7,
                         (OnOrUsing *)0x0);
      if (pParse->nErr == 0) {
        pSVar15 = p;
        pSVar16 = pSVar7;
        for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
          uVar3 = pSVar15->field_0x1;
          LVar4 = pSVar15->nSelectRow;
          uVar5 = pSVar15->selFlags;
          pSVar16->op = pSVar15->op;
          pSVar16->field_0x1 = uVar3;
          pSVar16->nSelectRow = LVar4;
          pSVar16->selFlags = uVar5;
          pSVar15 = (Select *)((long)pSVar15 + (ulong)bVar17 * -0x10 + 8);
          pSVar16 = (Select *)((long)pSVar16 + (ulong)bVar17 * -0x10 + 8);
        }
        p->pSrc = pList;
        local_48.z = (char *)0x0;
        local_48.n = 0;
        local_48._12_4_ = 0xaaaaaaaa;
        pExpr = sqlite3ExprAlloc(db,0xb4,&local_48,0);
        pEVar8 = sqlite3ExprListAppendNew(pParse->db,pExpr);
        p->pEList = pEVar8;
        p->op = 0x8b;
        p->pWhere = (Expr *)0x0;
        pSVar7->pOrderBy = (ExprList *)0x0;
        pSVar7->pGroupBy = (ExprList *)0x0;
        pSVar7->pHaving = (Expr *)0x0;
        p->pWith = (With *)0x0;
        p->pWinDefn = (Window *)0x0;
        p->pPrior = (Select *)0x0;
        p->pNext = (Select *)0x0;
        p->selFlags = p->selFlags & 0xfffefeff | 0x10000;
        pSVar7->pPrior->pNext = pSVar7;
        pSVar7->pLimit = (Expr *)0x0;
        iVar14 = 0;
      }
      else {
        sqlite3SrcListDelete(db,pList);
      }
    }
  }
LAB_00184c93:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar14;
}

Assistant:

static int convertCompoundSelectToSubquery(Walker *pWalker, Select *p){
  int i;
  Select *pNew;
  Select *pX;
  sqlite3 *db;
  struct ExprList_item *a;
  SrcList *pNewSrc;
  Parse *pParse;
  Token dummy;

  if( p->pPrior==0 ) return WRC_Continue;
  if( p->pOrderBy==0 ) return WRC_Continue;
  for(pX=p; pX && (pX->op==TK_ALL || pX->op==TK_SELECT); pX=pX->pPrior){}
  if( pX==0 ) return WRC_Continue;
  a = p->pOrderBy->a;
#ifndef SQLITE_OMIT_WINDOWFUNC
  /* If iOrderByCol is already non-zero, then it has already been matched
  ** to a result column of the SELECT statement. This occurs when the
  ** SELECT is rewritten for window-functions processing and then passed
  ** to sqlite3SelectPrep() and similar a second time. The rewriting done
  ** by this function is not required in this case. */
  if( a[0].u.x.iOrderByCol ) return WRC_Continue;
#endif
  for(i=p->pOrderBy->nExpr-1; i>=0; i--){
    if( a[i].pExpr->flags & EP_Collate ) break;
  }
  if( i<0 ) return WRC_Continue;

  /* If we reach this point, that means the transformation is required. */

  pParse = pWalker->pParse;
  db = pParse->db;
  pNew = sqlite3DbMallocZero(db, sizeof(*pNew) );
  if( pNew==0 ) return WRC_Abort;
  memset(&dummy, 0, sizeof(dummy));
  pNewSrc = sqlite3SrcListAppendFromTerm(pParse,0,0,0,&dummy,pNew,0);
  assert( pNewSrc!=0 || pParse->nErr );
  if( pParse->nErr ){
    sqlite3SrcListDelete(db, pNewSrc);
    return WRC_Abort;
  }
  *pNew = *p;
  p->pSrc = pNewSrc;
  p->pEList = sqlite3ExprListAppend(pParse, 0, sqlite3Expr(db, TK_ASTERISK, 0));
  p->op = TK_SELECT;
  p->pWhere = 0;
  pNew->pGroupBy = 0;
  pNew->pHaving = 0;
  pNew->pOrderBy = 0;
  p->pPrior = 0;
  p->pNext = 0;
  p->pWith = 0;
#ifndef SQLITE_OMIT_WINDOWFUNC
  p->pWinDefn = 0;
#endif
  p->selFlags &= ~SF_Compound;
  assert( (p->selFlags & SF_Converted)==0 );
  p->selFlags |= SF_Converted;
  assert( pNew->pPrior!=0 );
  pNew->pPrior->pNext = pNew;
  pNew->pLimit = 0;
  return WRC_Continue;
}